

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_twod_orientation(REF_GRID ref_grid)

{
  REF_NODE ref_node_00;
  bool bVar1;
  REF_STATUS RVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL valid;
  REF_BOOL correct_orientation;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  bVar1 = true;
  if (ref_grid->twod == 0) {
    ref_grid_local._4_4_ = 0;
  }
  else {
    unique0x00012000 = ref_grid->cell[3];
    for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffd8->max; nodes[0x19] = nodes[0x19] + 1)
    {
      RVar2 = ref_cell_nodes(stack0xffffffffffffffd8,nodes[0x19],&valid);
      if (RVar2 == 0) {
        uVar3 = ref_node_tri_twod_orientation(ref_node_00,&valid,&ref_private_macro_code_rss);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x1fe,"ref_validation_twod_orientation",(ulong)uVar3,"valid");
          return uVar3;
        }
        if (ref_private_macro_code_rss == 0) {
          bVar1 = false;
          printf("tri %d %d %d %d\n",(ulong)(uint)valid,(ulong)(uint)correct_orientation,
                 (ulong)(uint)nodes[0],(ulong)(uint)nodes[1]);
        }
      }
    }
    if (bVar1) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x205,"ref_validation_twod_orientation","incorrect twod tri orientation");
      ref_grid_local._4_4_ = 1;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_validation_twod_orientation(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL correct_orientation, valid = REF_TRUE;

  if (!ref_grid_twod(ref_grid)) return REF_SUCCESS;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &correct_orientation),
        "valid");
    if (!correct_orientation) {
      valid = REF_FALSE;
      printf("tri %d %d %d %d\n", nodes[0], nodes[1], nodes[2], nodes[3]);
    }
  }

  RAS(valid, "incorrect twod tri orientation");

  return REF_SUCCESS;
}